

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O2

void __thiscall QUndoStack::endMacro(QUndoStack *this)

{
  QUndoStackPrivate *this_00;
  long in_FS_OFFSET;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QUndoStackPrivate **)&this->field_0x8;
  if ((this_00->macro_stack).d.size == 0) {
    local_30[0] = '\x02';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_30[0x14] = '\0';
    local_30[0x15] = '\0';
    local_30[0x16] = '\0';
    local_30[0x17] = '\0';
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    local_30[8] = '\0';
    local_30[9] = '\0';
    local_30[10] = '\0';
    local_30[0xb] = '\0';
    local_30[0xc] = '\0';
    local_30[0xd] = '\0';
    local_30[0xe] = '\0';
    local_30[0xf] = '\0';
    local_30[0x10] = '\0';
    local_30[0x11] = '\0';
    local_30[0x12] = '\0';
    local_30[0x13] = '\0';
    local_18 = "default";
    QMessageLogger::warning(local_30,"QUndoStack::endMacro(): no matching beginMacro()");
  }
  else {
    QList<QUndoCommand_*>::removeLast(&this_00->macro_stack);
    if ((this_00->macro_stack).d.size == 0) {
      QUndoStackPrivate::checkUndoLimit(this_00);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QUndoStackPrivate::setIndex(this_00,this_00->index + 1,false);
        return;
      }
      goto LAB_00562af9;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_00562af9:
  __stack_chk_fail();
}

Assistant:

void QUndoStack::endMacro()
{
    Q_D(QUndoStack);
    if (Q_UNLIKELY(d->macro_stack.isEmpty())) {
        qWarning("QUndoStack::endMacro(): no matching beginMacro()");
        return;
    }

    d->macro_stack.removeLast();

    if (d->macro_stack.isEmpty()) {
        d->checkUndoLimit();
        d->setIndex(d->index + 1, false);
    }
}